

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O1

void wavefront_starvation(size_t W)

{
  U *pUVar1;
  _Result_base *p_Var2;
  int iVar3;
  pointer pTVar4;
  code *pcVar5;
  double dVar6;
  undefined1 *puVar7;
  char cVar8;
  char extraout_AL;
  bool bVar9;
  Node *pNVar10;
  ulong *puVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  undefined8 uVar17;
  Executor *this;
  size_t in_RDI;
  long lVar18;
  size_t next_i;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar20;
  atomic<unsigned_long> count;
  string __str_1;
  ResultBuilder DOCTEST_RB;
  string __str;
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  G;
  atomic<unsigned_long> blocked;
  atomic<unsigned_long> stop;
  mutex mutex;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  Taskflow taskflow;
  Executor executor;
  size_t local_3c0;
  Result local_3b8;
  long local_398;
  ulong **local_390;
  uint local_388;
  undefined4 uStack_384;
  ulong *local_380 [2];
  undefined1 local_370 [16];
  element_type *local_360;
  _Head_base<0UL,_std::__future_base::_Result_base_*,_false> _Stack_358;
  char *local_350;
  undefined2 local_348;
  anon_union_24_2_13149d16_for_String_2 local_340;
  anon_union_24_2_13149d16_for_String_2 aStack_328;
  bool local_310;
  char *local_308;
  char *local_300;
  long *local_2f8;
  uint local_2f0;
  long local_2e8 [2];
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  local_2d8;
  long local_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [8];
  shared_ptr<tf::WorkerInterface> local_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_268;
  undefined1 local_230 [80];
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1c8;
  bool local_170;
  Executor local_168;
  
  local_230._0_8_ = &local_1e0;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = (__pthread_internal_list *)0x0;
  local_230._40_8_ = (__pthread_internal_list *)0x0;
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_1e0 = (pointer)0x0;
  puStack_1d8 = (pointer)0x0;
  local_1d0 = (pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_3c0 = in_RDI;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1c8,0);
  local_170 = false;
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,local_3c0,&local_2a8);
  if (local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_398 = 0;
  local_278 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_268._M_buckets = &local_268._M_single_bucket;
  local_268._M_bucket_count = 1;
  local_268._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_268._M_element_count = 0;
  local_268._M_rehash_policy._M_max_load_factor = 1.0;
  local_268._M_rehash_policy._M_next_resize = 0;
  local_268._M_single_bucket = (__node_base_ptr)0x0;
  local_2d8.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
  ::resize(&local_2d8,local_3c0);
  if (local_3c0 != 0) {
    puVar7 = (undefined1 *)((long)local_3b8.m_decomp.field_0.buf + 8);
    uVar14 = 0;
    do {
      local_2c0 = uVar14 * 3;
      std::vector<tf::Task,_std::allocator<tf::Task>_>::resize
                (local_2d8.
                 super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14,local_3c0);
      if (local_3c0 != 0) {
        uVar15 = 0;
        do {
          uVar17 = local_230._0_8_;
          if (uVar15 + uVar14 == 0) {
            pNVar10 = (Node *)operator_new(0xd8);
            pNVar10->_nstate = 0;
            pNVar10->_estate = (__atomic_base<int>)0x0;
            (pNVar10->_name)._M_dataplus._M_p = (pointer)&(pNVar10->_name).field_2;
            (pNVar10->_name)._M_string_length = 0;
            (pNVar10->_name).field_2._M_local_buf[0] = '\0';
            pUVar1 = &(pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
                      super_SmallVectorTemplateBase<tf::Node_*,_true>.
                      super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
            pNVar10->_data = (void *)0x0;
            pNVar10->_topology = (Topology *)0x0;
            pNVar10->_parent = (Node *)0x0;
            pNVar10->_num_successors = 0;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
                 &pNVar10->_join_counter;
            (pNVar10->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined8 *)
             &(pNVar10->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 8) = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x10) = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x18) = 0;
            plVar12 = (long *)operator_new(0x20);
            *plVar12 = (long)&local_398;
            plVar12[1] = (long)local_2b0;
            plVar12[2] = (long)local_2b8;
            plVar12[3] = (long)&local_268;
            *(long **)&(pNVar10->_handle).
                       super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       ._M_u = plVar12;
            *(code **)((long)&(pNVar10->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x18) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:740:36)>
                 ::_M_invoke;
            *(code **)((long)&(pNVar10->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x10) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:740:36)>
                 ::_M_manager;
            *(__index_type *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x38) = '\x01';
            (pNVar10->_semaphores)._M_t.
            super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
            _M_t.
            super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
            .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
            (pNVar10->_exception_ptr)._M_exception_object = (void *)0x0;
            local_370._0_8_ = pNVar10;
            std::
            vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
            ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                      ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                        *)uVar17,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_370);
          }
          else if (uVar15 + uVar14 + 1 == local_3c0) {
            pNVar10 = (Node *)operator_new(0xd8);
            pNVar10->_nstate = 0;
            pNVar10->_estate = (__atomic_base<int>)0x0;
            (pNVar10->_name)._M_dataplus._M_p = (pointer)&(pNVar10->_name).field_2;
            (pNVar10->_name)._M_string_length = 0;
            (pNVar10->_name).field_2._M_local_buf[0] = '\0';
            pUVar1 = &(pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
                      super_SmallVectorTemplateBase<tf::Node_*,_true>.
                      super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
            pNVar10->_data = (void *)0x0;
            pNVar10->_topology = (Topology *)0x0;
            pNVar10->_parent = (Node *)0x0;
            pNVar10->_num_successors = 0;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
            (pNVar10->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
                 &pNVar10->_join_counter;
            (pNVar10->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined8 *)
             &(pNVar10->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 8) = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x10) = 0;
            *(undefined8 *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x18) = 0;
            puVar11 = (ulong *)operator_new(0x48);
            *puVar11 = uVar14;
            puVar11[1] = uVar15;
            puVar11[2] = (ulong)&local_398;
            puVar11[3] = (ulong)&local_3c0;
            puVar11[4] = (ulong)local_2b8;
            puVar11[5] = (ulong)local_2b0;
            puVar11[6] = (ulong)&local_268;
            puVar11[7] = (ulong)&local_298;
            puVar11[8] = (ulong)&local_168;
            *(ulong **)
             &(pNVar10->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = puVar11;
            *(code **)((long)&(pNVar10->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x18) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:750:36)>
                 ::_M_invoke;
            *(code **)((long)&(pNVar10->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x10) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:750:36)>
                 ::_M_manager;
            *(__index_type *)
             ((long)&(pNVar10->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x38) = '\x01';
            (pNVar10->_semaphores)._M_t.
            super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
            _M_t.
            super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
            .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
            (pNVar10->_exception_ptr)._M_exception_object = (void *)0x0;
            local_370._0_8_ = pNVar10;
            std::
            vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
            ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                      ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                        *)uVar17,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_370);
          }
          else {
            local_370._0_8_ = operator_new(0xd8);
            ((Node *)local_370._0_8_)->_nstate = 0;
            ((Node *)local_370._0_8_)->_estate = (__atomic_base<int>)0x0;
            (((Node *)local_370._0_8_)->_name)._M_dataplus._M_p =
                 (pointer)&(((Node *)local_370._0_8_)->_name).field_2;
            (((Node *)local_370._0_8_)->_name)._M_string_length = 0;
            (((Node *)local_370._0_8_)->_name).field_2._M_local_buf[0] = '\0';
            pUVar1 = &(((Node *)local_370._0_8_)->_edges).super_SmallVectorImpl<tf::Node_*>.
                      super_SmallVectorTemplateBase<tf::Node_*,_true>.
                      super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
            ((Node *)local_370._0_8_)->_data = (void *)0x0;
            ((Node *)local_370._0_8_)->_topology = (Topology *)0x0;
            ((Node *)local_370._0_8_)->_parent = (Node *)0x0;
            ((Node *)local_370._0_8_)->_num_successors = 0;
            (((Node *)local_370._0_8_)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
            (((Node *)local_370._0_8_)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
            (((Node *)local_370._0_8_)->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
                 &((Node *)local_370._0_8_)->_join_counter;
            (((Node *)local_370._0_8_)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined8 *)
             &(((Node *)local_370._0_8_)->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = 0;
            *(undefined8 *)
             ((long)&(((Node *)local_370._0_8_)->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 8) = 0;
            *(undefined8 *)
             ((long)&(((Node *)local_370._0_8_)->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x10) = 0;
            *(long **)&(((Node *)local_370._0_8_)->_handle).
                       super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       .
                       super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       ._M_u = &local_398;
            *(code **)((long)&(((Node *)local_370._0_8_)->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x18) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:780:36)>
                 ::_M_invoke;
            *(code **)((long)&(((Node *)local_370._0_8_)->_handle).
                              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                              .
                              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      + 0x10) =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:780:36)>
                 ::_M_manager;
            *(__index_type *)
             ((long)&(((Node *)local_370._0_8_)->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x38) = '\x01';
            (((Node *)local_370._0_8_)->_semaphores)._M_t.
            super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
            _M_t.
            super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
            .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
            (((Node *)local_370._0_8_)->_exception_ptr)._M_exception_object = (void *)0x0;
            std::
            vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
            ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                      ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                        *)uVar17,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_370);
          }
          if ((Node *)local_370._0_8_ != (Node *)0x0) {
            std::default_delete<tf::Node>::operator()
                      ((default_delete<tf::Node> *)local_370,(Node *)local_370._0_8_);
          }
          pTVar4 = (&((local_2d8.
                       super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<tf::Task,_std::allocator<tf::Task>_>)._M_impl.
                     super__Vector_impl_data._M_start)[local_2c0];
          pTVar4[uVar15]._node =
               (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  *)uVar17)->
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
          cVar16 = '\x01';
          if (9 < uVar14) {
            uVar13 = uVar14;
            cVar8 = '\x04';
            do {
              cVar16 = cVar8;
              if (uVar13 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_0011510d;
              }
              if (uVar13 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_0011510d;
              }
              if (uVar13 < 10000) goto LAB_0011510d;
              bVar9 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar8 = cVar16 + '\x04';
            } while (bVar9);
            cVar16 = cVar16 + '\x01';
          }
LAB_0011510d:
          local_2f8 = local_2e8;
          std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,uVar14);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_2f8);
          puVar11 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar11) {
            local_3b8.m_decomp.field_0._8_8_ = *puVar11;
            local_3b8.m_decomp.field_0._16_8_ = plVar12[3];
            local_3b8._0_8_ = puVar7;
          }
          else {
            local_3b8.m_decomp.field_0._8_8_ = *puVar11;
            local_3b8._0_8_ = (ulong *)*plVar12;
          }
          local_3b8.m_decomp.field_0.data.ptr = (char *)plVar12[1];
          *plVar12 = (long)puVar11;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          cVar16 = '\x01';
          if (9 < uVar15) {
            uVar13 = uVar15;
            cVar8 = '\x04';
            do {
              cVar16 = cVar8;
              if (uVar13 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_001151f3;
              }
              if (uVar13 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_001151f3;
              }
              if (uVar13 < 10000) goto LAB_001151f3;
              bVar9 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar8 = cVar16 + '\x04';
            } while (bVar9);
            cVar16 = cVar16 + '\x01';
          }
LAB_001151f3:
          local_390 = local_380;
          std::__cxx11::string::_M_construct((ulong)&local_390,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_390,local_388,uVar15);
          uVar17 = (ulong *)0xf;
          if ((undefined1 *)local_3b8._0_8_ != puVar7) {
            uVar17 = local_3b8.m_decomp.field_0._8_8_;
          }
          if ((ulong)uVar17 < local_3b8.m_decomp.field_0.data.ptr + CONCAT44(uStack_384,local_388))
          {
            puVar11 = (ulong *)0xf;
            if (local_390 != local_380) {
              puVar11 = local_380[0];
            }
            if (puVar11 < local_3b8.m_decomp.field_0.data.ptr + CONCAT44(uStack_384,local_388))
            goto LAB_0011525e;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_390,0,(char *)0x0,local_3b8._0_8_);
          }
          else {
LAB_0011525e:
            plVar12 = (long *)std::__cxx11::string::_M_append(&local_3b8.m_passed,(ulong)local_390);
          }
          pNVar10 = (Node *)(plVar12 + 2);
          if ((Node *)*plVar12 == pNVar10) {
            local_360 = *(element_type **)pNVar10;
            _Stack_358._M_head_impl = (_Result_base *)plVar12[3];
            local_370._0_8_ = (Node *)&local_360;
          }
          else {
            local_360 = *(element_type **)pNVar10;
            local_370._0_8_ = (Node *)*plVar12;
          }
          local_370._8_8_ = plVar12[1];
          *plVar12 = (long)pNVar10;
          plVar12[1] = 0;
          *(undefined1 *)&pNVar10->_nstate = 0;
          std::__cxx11::string::_M_assign((string *)&(pTVar4[uVar15]._node)->_name);
          if ((Node *)local_370._0_8_ != (Node *)&local_360) {
            operator_delete((void *)local_370._0_8_,(ulong)((long)&local_360->_taskflow + 1));
          }
          if (local_390 != local_380) {
            operator_delete(local_390,(long)local_380[0] + 1);
          }
          if ((undefined1 *)local_3b8._0_8_ != puVar7) {
            operator_delete((void *)local_3b8._0_8_,local_3b8.m_decomp.field_0._8_8_ + 1);
          }
          if (local_2f8 != local_2e8) {
            operator_delete(local_2f8,local_2e8[0] + 1);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < local_3c0);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_3c0);
  }
  if (local_3c0 != 0) {
    uVar14 = 0;
    do {
      if (local_3c0 != 0) {
        lVar18 = 0;
        uVar15 = 0;
        do {
          if (uVar14 + 1 < local_3c0) {
            tf::Task::precede<tf::Task&>
                      ((Task *)((long)&(local_2d8.
                                        super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                        super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->_node + lVar18),
                       (Task *)((long)&(local_2d8.
                                        super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar14 + 1].
                                        super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->_node + lVar18));
          }
          uVar15 = uVar15 + 1;
          if (uVar15 < local_3c0) {
            pTVar4 = local_2d8.
                     super__Vector_base<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                     super__Vector_impl_data._M_start;
            tf::Task::precede<tf::Task&>
                      ((Task *)((long)&pTVar4->_node + lVar18),
                       (Task *)((long)&pTVar4[1]._node + lVar18));
          }
          lVar18 = lVar18 + 8;
        } while (uVar15 < local_3c0);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_3c0);
  }
  local_3b8._0_8_ = 0x400;
  this = &local_168;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>
            ((Future<void> *)local_370,this,(Taskflow *)local_230,
             (anon_class_8_1_69701ed9 *)&local_3b8,(anon_class_1_0_00000001 *)&local_2f8);
  if ((Node *)local_370._0_8_ != (Node *)0x0) {
    std::__future_base::_State_baseV2::wait((_State_baseV2 *)local_370._0_8_,this);
    if (_Stack_358._M_head_impl != (_Result_base *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = _Stack_358._M_head_impl + 0xc;
        iVar3 = *(int *)p_Var2;
        *(int *)p_Var2 = *(int *)p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar3 = *(int *)(_Stack_358._M_head_impl + 0xc);
        *(int *)(_Stack_358._M_head_impl + 0xc) = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (**(code **)(*(long *)_Stack_358._M_head_impl + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_);
    }
    local_340.buf[0] = '\0';
    local_340.buf[0x17] = '\x17';
    aStack_328.buf[0] = '\0';
    aStack_328.buf[0x17] = '\x17';
    local_370._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_370._8_4_ = 0xc;
    local_360 = (element_type *)0x13103f;
    _Stack_358._M_head_impl._0_4_ = 0x327;
    local_350 = "count == W*W*1024";
    local_348._0_1_ = true;
    local_348._1_1_ = false;
    local_310 = false;
    local_308 = "";
    local_300 = "";
    local_2f8 = &local_398;
    local_2f0 = 0xc;
    local_390 = (ulong **)(local_3c0 * local_3c0 * 0x400);
    doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
              (&local_3b8,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_2f8,
               (unsigned_long *)&local_390);
    doctest::String::operator=((String *)&aStack_328.data,&local_3b8.m_decomp);
    local_348 = CONCAT11(local_348._1_1_,local_3b8.m_passed) ^ 1;
    uVar19 = extraout_XMM0_Da;
    uVar20 = extraout_XMM0_Db;
    if (((long)local_3b8.m_decomp.field_0._16_8_ < 0) &&
       (local_3b8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3b8.m_decomp.field_0.data.ptr);
      uVar19 = extraout_XMM0_Da_00;
      uVar20 = extraout_XMM0_Db_00;
    }
    dVar6 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_370,(double)CONCAT44(uVar20,uVar19));
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)(SUB84(dVar6,0));
      return;
    }
    if (local_348._0_1_ == true) {
      bVar9 = doctest::detail::checkIfShouldThrow(local_370._8_4_);
      if (bVar9) goto LAB_0011560b;
    }
    if ((aStack_328.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_328._1_7_,aStack_328.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_328._1_7_,aStack_328.buf[0]));
    }
    if ((local_340.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_340._1_7_,local_340.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_340._1_7_,local_340.buf[0]));
    }
    std::
    vector<std::vector<tf::Task,_std::allocator<tf::Task>_>,_std::allocator<std::vector<tf::Task,_std::allocator<tf::Task>_>_>_>
    ::~vector(&local_2d8);
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_268);
    tf::Executor::~Executor(&local_168);
    tf::Taskflow::~Taskflow((Taskflow *)local_230);
    return;
  }
  std::__throw_future_error(3);
LAB_0011560b:
  doctest::detail::throwException();
}

Assistant:

void wavefront_starvation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count{0}, blocked;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  std::vector<std::vector<tf::Task>> G;
  G.resize(W);

  // create tasks
  for(size_t i=0; i<W; i++) {
    G[i].resize(W);
    for(size_t j=0; j<W; j++) {
      // source
      if(i + j == 0) {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
          stop.store(false, std::memory_order_relaxed);
          blocked.store(0, std::memory_order_relaxed);
          set.clear();
        });
      }
      // diagonal tasks
      else if(i + j + 1 == W) {
        
        G[i][j] = taskflow.emplace([&, i, j](){

          count.fetch_add(1, std::memory_order_relaxed);
          
          // top-right will unblock all W-1 workers
          if(i == 0 && j + 1 == W) {
            while(blocked.load(std::memory_order_acquire) + 1 != W) {
              std::this_thread::yield();
            }
            stop.store(true, std::memory_order_relaxed);
            REQUIRE(set.size() + 1 == W);
          }
          else {
            // record the worker
            {
              std::scoped_lock lock(mutex);
              set.insert(executor.this_worker_id());
            }

            blocked.fetch_add(1, std::memory_order_release);

            // block the worker
            while(stop.load(std::memory_order_relaxed) == false) {
              std::this_thread::yield();
            }
          }
        });
      }
      // other tasks
      else {
        G[i][j] = taskflow.emplace([&](){
          count.fetch_add(1, std::memory_order_relaxed);
        });
      }

      // name the task
      G[i][j].name(std::to_string(i) + ", " + std::to_string(j));
    }
  }

  // create dependency
  for(size_t i=0; i<W; i++) {
    for(size_t j=0; j<W; j++) {
      size_t next_i = i + 1;
      size_t next_j = j + 1;
      if(next_i < W) {
        G[i][j].precede(G[next_i][j]);
      }
      if(next_j < W) {
        G[i][j].precede(G[i][next_j]);
      }
    }
  }

  //taskflow.dump(std::cout);
  executor.run_n(taskflow, 1024).wait();

  REQUIRE(count == W*W*1024);
}